

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O2

int v3_check_critical(char **value)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  
  pcVar5 = *value;
  sVar4 = strlen(pcVar5);
  iVar3 = 0;
  if (8 < sVar4) {
    iVar2 = strncmp(pcVar5,"critical,",9);
    if (iVar2 == 0) {
      pcVar5 = pcVar5 + 8;
      do {
        pbVar1 = (byte *)(pcVar5 + 1);
        pcVar5 = pcVar5 + 1;
        iVar3 = OPENSSL_isspace((uint)*pbVar1);
      } while (iVar3 != 0);
      *value = pcVar5;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int v3_check_critical(const char **value) {
  const char *p = *value;
  if ((strlen(p) < 9) || strncmp(p, "critical,", 9)) {
    return 0;
  }
  p += 9;
  while (OPENSSL_isspace((unsigned char)*p)) {
    p++;
  }
  *value = p;
  return 1;
}